

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uuid.cpp
# Opt level: O2

void __thiscall Uuid_Bad_Test::~Uuid_Bad_Test(Uuid_Bad_Test *this)

{
  anon_unknown.dwarf_42f0ba::Uuid::~Uuid(&this->super_Uuid);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F (Uuid, Bad) {
    pstore::uuid id;
    auto parser = make_json_uuid_parser (&id);
    parser.input (R"("bad")"s).eof ();
    EXPECT_TRUE (parser.has_error ());
    EXPECT_EQ (parser.last_error (),
               make_error_code (pstore::exchange::import_ns::error::bad_uuid));
}